

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_create(REF_CAVITY *ref_cavity_ptr)

{
  uint uVar1;
  REF_CAVITY pRVar2;
  REF_INT *pRVar3;
  long lVar4;
  REF_INT *pRVar5;
  ulong uVar6;
  char *pcVar7;
  undefined8 uStack_20;
  
  pRVar2 = (REF_CAVITY)malloc(0x78);
  *ref_cavity_ptr = pRVar2;
  if (pRVar2 == (REF_CAVITY)0x0) {
    pcVar7 = "malloc *ref_cavity_ptr of REF_CAVITY_STRUCT NULL";
    uStack_20 = 0x26;
  }
  else {
    pRVar2->state = REF_CAVITY_UNKNOWN;
    pRVar2->ref_grid = (REF_GRID)0x0;
    pRVar2->node = -1;
    pRVar2->surf_node = -1;
    pRVar2->nseg = 0;
    pRVar2->maxseg = 10;
    pRVar3 = (REF_INT *)malloc(0x78);
    pRVar2->s2n = pRVar3;
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar7 = "malloc ref_cavity->s2n of REF_INT NULL";
      uStack_20 = 0x33;
    }
    else {
      for (lVar4 = 0; lVar4 != 0x1e; lVar4 = lVar4 + 1) {
        pRVar3[lVar4] = 0;
      }
      pRVar5 = pRVar3 + 1;
      uVar6 = 0;
      while (uVar6 < 10) {
        pRVar5[-1] = -1;
        uVar6 = uVar6 + 1;
        *pRVar5 = (REF_INT)uVar6;
        pRVar5 = pRVar5 + 3;
      }
      pRVar3[0x1c] = -1;
      pRVar2->blankseg = 0;
      pRVar2->nface = 0;
      pRVar2->maxface = 10;
      pRVar3 = (REF_INT *)malloc(0x78);
      pRVar2->f2n = pRVar3;
      if (pRVar3 != (REF_INT *)0x0) {
        for (lVar4 = 0; lVar4 != 0x1e; lVar4 = lVar4 + 1) {
          pRVar3[lVar4] = 0;
        }
        pRVar5 = pRVar3 + 1;
        uVar6 = 0;
        while (uVar6 < 10) {
          pRVar5[-1] = -1;
          uVar6 = uVar6 + 1;
          *pRVar5 = (REF_INT)uVar6;
          pRVar5 = pRVar5 + 3;
        }
        pRVar3[0x1c] = -1;
        pRVar2->blankface = 0;
        uVar1 = ref_list_create(&pRVar2->tri_list);
        if (uVar1 == 0) {
          uVar1 = ref_list_create(&pRVar2->tet_list);
          if (uVar1 == 0) {
            pRVar2->min_normdev = 0.5;
            pRVar2->split_node0 = -1;
            pRVar2->split_node1 = -1;
            pRVar2->collapse_node0 = -1;
            pRVar2->collapse_node1 = -1;
            pRVar2->seg_rm_adds_tet = 0;
            pRVar2->debug = 0;
            return 0;
          }
          pcVar7 = "tet list";
          uStack_20 = 0x48;
        }
        else {
          pcVar7 = "tri list";
          uStack_20 = 0x47;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uStack_20,"ref_cavity_create",(ulong)uVar1,pcVar7);
        return uVar1;
      }
      pcVar7 = "malloc ref_cavity->f2n of REF_INT NULL";
      uStack_20 = 0x3f;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
         uStack_20,"ref_cavity_create",pcVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_create(REF_CAVITY *ref_cavity_ptr) {
  REF_CAVITY ref_cavity;
  REF_INT seg, face;

  ref_malloc(*ref_cavity_ptr, 1, REF_CAVITY_STRUCT);
  ref_cavity = (*ref_cavity_ptr);

  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  ref_cavity_grid(ref_cavity) = (REF_GRID)NULL;
  ref_cavity_node(ref_cavity) = REF_EMPTY;
  ref_cavity_surf_node(ref_cavity) = REF_EMPTY;

  ref_cavity_nseg(ref_cavity) = 0;
  ref_cavity_maxseg(ref_cavity) = 10;

  ref_malloc_init(ref_cavity->s2n, ref_cavity_maxseg(ref_cavity) * 3, REF_INT,
                  0);
  for (seg = 0; seg < ref_cavity_maxseg(ref_cavity); seg++) {
    ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
    ref_cavity_s2n(ref_cavity, 1, seg) = seg + 1;
  }
  ref_cavity_s2n(ref_cavity, 1, ref_cavity_maxseg(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankseg(ref_cavity) = 0;

  ref_cavity_nface(ref_cavity) = 0;
  ref_cavity_maxface(ref_cavity) = 10;

  ref_malloc_init(ref_cavity->f2n, ref_cavity_maxface(ref_cavity) * 3, REF_INT,
                  0);
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
    ref_cavity_f2n(ref_cavity, 1, face) = face + 1;
  }
  ref_cavity_f2n(ref_cavity, 1, ref_cavity_maxface(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankface(ref_cavity) = 0;

  RSS(ref_list_create(&(ref_cavity->tri_list)), "tri list");
  RSS(ref_list_create(&(ref_cavity->tet_list)), "tet list");

  ref_cavity->min_normdev = 0.5;

  ref_cavity->split_node0 = REF_EMPTY;
  ref_cavity->split_node1 = REF_EMPTY;
  ref_cavity->collapse_node0 = REF_EMPTY;
  ref_cavity->collapse_node1 = REF_EMPTY;

  ref_cavity->seg_rm_adds_tet = REF_FALSE;

  ref_cavity->debug = REF_FALSE;

  return REF_SUCCESS;
}